

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void assign_adjust(LexState *ls,BCReg nvars,BCReg nexps,ExpDesc *e)

{
  BCReg *pBVar1;
  FuncState *fs;
  BCReg n;
  BCReg BVar2;
  
  fs = ls->fs;
  n = nvars - nexps;
  if (e->k != VVOID) {
    if (e->k == VCALL) {
      BVar2 = 0xffffffff;
      if (-1 < (int)n) {
        BVar2 = n;
      }
      *(char *)((long)&fs->bcbase[(e->u).s.info].ins + 3) = (char)BVar2 + '\x02';
      if (0 < (int)n) {
        bcreg_reserve(fs,BVar2);
      }
      goto LAB_0012231f;
    }
    expr_tonextreg(fs,e);
  }
  if (0 < (int)n) {
    BVar2 = fs->freereg;
    bcreg_reserve(fs,n);
    bcemit_nil(fs,BVar2,n);
  }
LAB_0012231f:
  if (nvars < nexps) {
    pBVar1 = &ls->fs->freereg;
    *pBVar1 = *pBVar1 + n;
  }
  return;
}

Assistant:

static void assign_adjust(LexState *ls, BCReg nvars, BCReg nexps, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  int32_t extra = (int32_t)nvars - (int32_t)nexps;
  if (e->k == VCALL) {
    extra++;  /* Compensate for the VCALL itself. */
    if (extra < 0) extra = 0;
    setbc_b(bcptr(fs, e), extra+1);  /* Fixup call results. */
    if (extra > 1) bcreg_reserve(fs, (BCReg)extra-1);
  } else {
    if (e->k != VVOID)
      expr_tonextreg(fs, e);  /* Close last expression. */
    if (extra > 0) {  /* Leftover LHS are set to nil. */
      BCReg reg = fs->freereg;
      bcreg_reserve(fs, (BCReg)extra);
      bcemit_nil(fs, reg, (BCReg)extra);
    }
  }
  if (nexps > nvars)
    ls->fs->freereg -= nexps - nvars;  /* Drop leftover regs. */
}